

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_29ca355::LowBDConvolveHorizRSTest_Correctness_Test::TestBody
          (LowBDConvolveHorizRSTest_Correctness_Test *this)

{
  undefined8 *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  TestImage<unsigned_char> *pTVar7;
  ulong uVar8;
  void **val2;
  long lVar9;
  pointer puVar10;
  pointer *__ptr;
  size_t __n;
  long lVar11;
  SEARCH_METHODS *pSVar12;
  pointer puVar13;
  long lVar14;
  int iVar15;
  ACMRandom rnd;
  int32_t tst_value;
  int32_t ref_value;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  uint local_80;
  ACMRandom local_7c;
  AssertHelper local_78;
  internal local_70 [8];
  undefined8 *local_68;
  uint local_60;
  uint local_5c;
  LowBDConvolveHorizRSTest_Correctness_Test *local_58;
  TestImage<unsigned_char> **local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  local_7c.random_.state_ = (Random)0xbaba;
  local_50 = &(this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.
              image_;
  local_48 = 0;
  local_58 = this;
  do {
    local_80 = 9;
    do {
      uVar2 = testing::internal::Random::Generate(&local_7c.random_,0x80000000);
      uVar3 = testing::internal::Random::Generate(&local_7c.random_,0x80000000);
      uVar4 = testing::internal::Random::Generate(&local_7c.random_,0x80000000);
      pTVar7 = (TestImage<unsigned_char> *)operator_new(0x50);
      val2 = (void **)(ulong)local_80;
      TestImage<unsigned_char>::TestImage
                (pTVar7,(uVar3 >> 0x17 & 0xff) + 0x80,(uVar2 >> 0x17 & 0xff) + 0x200,local_80,
                 uVar4 >> 0xf & 0x3fff,
                 (this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>
                 .bd_);
      *local_50 = pTVar7;
      local_88._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::
      CmpHelperNE<(anonymous_namespace)::TestImage<unsigned_char>*,decltype(nullptr)>
                ((char *)local_70,(char *)local_50,(TestImage<unsigned_char> **)&local_88,val2);
      puVar1 = local_68;
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_88);
        if (local_68 == (undefined8 *)0x0) {
          pSVar12 = "";
        }
        else {
          pSVar12 = (SEARCH_METHODS *)*local_68;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
                   ,0xcd,(char *)pSVar12);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_88._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_88._M_head_impl + 8))();
        }
        if (local_68 == (undefined8 *)0x0) {
          return;
        }
        if ((undefined8 *)*local_68 != local_68 + 2) {
          operator_delete((undefined8 *)*local_68);
        }
        operator_delete(local_68);
        return;
      }
      if (local_68 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_68 != local_68 + 2) {
          operator_delete((undefined8 *)*local_68);
        }
        operator_delete(puVar1);
      }
      ConvolveHorizRSTestBase<unsigned_char>::Prep
                ((ConvolveHorizRSTestBase<unsigned_char> *)
                 (this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>
                 .image_,&local_7c);
      (*(this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.
        super_Test._vptr_Test[6])(this,1);
      (*(this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.
        super_Test._vptr_Test[6])(this,0);
      pTVar7 = (this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.
               image_;
      iVar15 = pTVar7->h_;
      lVar9 = (long)pTVar7->dst_stride_;
      puVar13 = (pTVar7->dst_data_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      __n = (size_t)((iVar15 + 0x40) * pTVar7->dst_stride_);
      iVar5 = bcmp(puVar13,puVar13 + __n,__n);
      if (iVar15 < 1 || iVar5 == 0) {
LAB_00804bf5:
        uVar6 = local_80;
        if (puVar13 != (pointer)0x0) {
          operator_delete(puVar13);
        }
        puVar13 = (pTVar7->src_data_).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (puVar13 != (pointer)0x0) {
          operator_delete(puVar13);
        }
      }
      else {
        uVar8 = (ulong)(uint)pTVar7->w_dst_;
        puVar10 = puVar13 + __n + lVar9 * 0x20 + 0x20;
        puVar13 = puVar13 + lVar9 * 0x20 + 0x20;
        lVar11 = 0x20;
        local_40 = lVar9;
        do {
          lVar14 = lVar11;
          if (0 < (int)uVar8) {
            lVar9 = 0;
            local_38 = lVar11;
            do {
              local_5c = (uint)puVar13[lVar9];
              local_60 = (uint)puVar10[lVar9];
              testing::internal::CmpHelperEQ<int,int>
                        (local_70,"tst_value","ref_value",(int *)&local_60,(int *)&local_5c);
              if (local_70[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_88);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_88._M_head_impl + 0x10),"Error at row: ",0xe);
                std::ostream::operator<<(local_88._M_head_impl + 0x10,(int)lVar11 + -0x20);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_88._M_head_impl + 0x10),", col: ",7);
                std::ostream::operator<<(local_88._M_head_impl + 0x10,(int)lVar9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_88._M_head_impl + 0x10),", superres_denom: ",0x12);
                std::ostream::operator<<(local_88._M_head_impl + 0x10,pTVar7->superres_denom_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_88._M_head_impl + 0x10),", height: ",10);
                std::ostream::operator<<(local_88._M_head_impl + 0x10,pTVar7->h_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_88._M_head_impl + 0x10),", src_width: ",0xd);
                std::ostream::operator<<(local_88._M_head_impl + 0x10,pTVar7->w_src_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_88._M_head_impl + 0x10),", dst_width: ",0xd);
                std::ostream::operator<<(local_88._M_head_impl + 0x10,pTVar7->w_dst_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_88._M_head_impl + 0x10),", x0: ",6);
                std::ostream::operator<<(local_88._M_head_impl + 0x10,pTVar7->x0_);
                pSVar12 = "";
                if (local_68 != (undefined8 *)0x0) {
                  pSVar12 = (SEARCH_METHODS *)*local_68;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_78,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
                           ,0xa2,(char *)pSVar12);
                testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_88);
                testing::internal::AssertHelper::~AssertHelper(&local_78);
                if (local_88._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_88._M_head_impl + 8))();
                }
              }
              puVar1 = local_68;
              if (local_68 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_68 != local_68 + 2) {
                  operator_delete((undefined8 *)*local_68);
                }
                operator_delete(puVar1);
              }
              uVar8 = (ulong)pTVar7->w_dst_;
              lVar14 = lVar9 + 0x20;
              lVar9 = lVar9 + 1;
            } while (lVar14 < (long)(uVar8 + 0x1f));
            iVar15 = pTVar7->h_;
            lVar9 = local_40;
            lVar14 = local_38;
          }
          lVar11 = lVar14 + 1;
          puVar10 = puVar10 + lVar9;
          puVar13 = puVar13 + lVar9;
        } while (lVar14 < iVar15 + 0x1f);
        pTVar7 = *local_50;
        this = local_58;
        if (pTVar7 != (TestImage<unsigned_char> *)0x0) {
          puVar13 = (pTVar7->dst_data_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_00804bf5;
        }
        pTVar7 = (TestImage<unsigned_char> *)0x0;
        uVar6 = local_80;
      }
      operator_delete(pTVar7);
      local_80 = uVar6 + 1;
    } while (local_80 != 0x11);
    uVar6 = (int)local_48 + 1;
    local_48 = (ulong)uVar6;
    if (uVar6 == 10) {
      return;
    }
  } while( true );
}

Assistant:

TEST_P(LowBDConvolveHorizRSTest, Correctness) { CorrectnessTest(); }